

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

int fsync_failure_cb(void *ctx,filemgr_ops *normal_ops,int fd)

{
  int *piVar1;
  undefined4 in_EDX;
  long in_RSI;
  int *in_RDI;
  fail_ctx_t *wctx;
  int local_4;
  
  in_RDI[1] = in_RDI[1] + 1;
  if (in_RDI[2] < in_RDI[1]) {
    *in_RDI = *in_RDI + 1;
    piVar1 = __errno_location();
    *piVar1 = -2;
    local_4 = -0xe;
  }
  else {
    local_4 = (**(code **)(in_RSI + 0x38))(in_EDX);
  }
  return local_4;
}

Assistant:

int fsync_failure_cb(void *ctx, struct filemgr_ops *normal_ops,
                     int fd) {
    fail_ctx_t *wctx = (fail_ctx_t *)ctx;
    wctx->num_ops++;
    if (wctx->num_ops > wctx->start_failing_after) {
        wctx->num_fails++;
        errno = -2;
        return (ssize_t)FDB_RESULT_FSYNC_FAIL;
    }

    return normal_ops->fsync(fd);
}